

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

csubstr __thiscall c4::yml::Parser::_scan_squot_scalar(Parser *this)

{
  Location LVar1;
  Location LVar2;
  Location LVar3;
  Location LVar4;
  Location LVar5;
  Location LVar6;
  Location LVar7;
  Location LVar8;
  substr s_00;
  csubstr fmt;
  char *pcVar9;
  bool bVar10;
  error_flags eVar11;
  Parser *in_RDI;
  char msg_8 [69];
  char msg_7 [59];
  char msg_6 [67];
  char msg_5 [24];
  char msg_4 [57];
  char msg_3 [44];
  char next;
  char curr;
  size_t i;
  bool line_is_blank;
  csubstr line;
  size_t pos;
  size_t numlines;
  bool needs_filter;
  char msg_2 [36];
  char msg_1 [50];
  char msg [41];
  substr s;
  size_t b;
  csubstr ret;
  size_t rnum;
  undefined4 in_stack_fffffffffffff830;
  undefined4 in_stack_fffffffffffff834;
  undefined4 in_stack_fffffffffffff838;
  undefined4 in_stack_fffffffffffff83c;
  undefined4 in_stack_fffffffffffff840;
  undefined4 in_stack_fffffffffffff844;
  char *in_stack_fffffffffffff848;
  Location *in_stack_fffffffffffff850;
  Location *this_00;
  undefined8 in_stack_fffffffffffff870;
  char c;
  undefined4 in_stack_fffffffffffff878;
  undefined1 in_stack_fffffffffffff87c;
  undefined1 in_stack_fffffffffffff87d;
  undefined1 in_stack_fffffffffffff87e;
  undefined1 in_stack_fffffffffffff87f;
  ulong local_780;
  Parser *in_stack_fffffffffffff8b0;
  pfn_error p_Var12;
  Parser *in_stack_fffffffffffff8e0;
  substr *psVar13;
  bool local_704;
  bool local_703;
  char local_702;
  undefined1 *in_stack_fffffffffffff908;
  Parser *in_stack_fffffffffffff910;
  bool local_692;
  bool local_691;
  undefined8 local_660;
  undefined8 uStack_658;
  Parser *in_stack_fffffffffffff9b0;
  char *in_stack_fffffffffffff9b8;
  size_t in_stack_fffffffffffff9c0;
  Location local_638;
  basic_substring<char> local_5f0;
  char *local_5e0;
  ulong local_5d8;
  char *local_5d0;
  ulong local_5c8;
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 local_5b0;
  undefined8 uStack_5a8;
  char *local_5a0;
  char local_598 [72];
  undefined8 local_550;
  undefined8 uStack_548;
  undefined8 local_540;
  undefined8 uStack_538;
  char *local_530;
  char local_528 [72];
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined8 local_4d0;
  undefined8 uStack_4c8;
  char *local_4c0;
  char local_4b8 [24];
  basic_substring<char_const> local_4a0 [16];
  undefined8 local_490;
  undefined8 uStack_488;
  undefined8 local_480;
  undefined8 uStack_478;
  char *local_470;
  char local_468 [72];
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 local_410;
  undefined8 uStack_408;
  char *local_400;
  char local_3f8 [46];
  char local_3ca;
  char local_3c9;
  ulong local_3c8;
  char local_3b9;
  basic_substring<const_char> local_3b8;
  ulong local_3a8;
  ulong local_3a0;
  bool local_391;
  char *local_390;
  ulong local_388;
  undefined4 uStack_378;
  undefined4 uStack_374;
  undefined4 local_370;
  undefined4 uStack_36c;
  undefined4 uStack_368;
  undefined4 uStack_364;
  char *local_360;
  undefined1 local_358 [40];
  undefined8 local_330;
  undefined8 local_328;
  undefined8 local_320;
  undefined8 uStack_318;
  Parser *in_stack_fffffffffffffcf0;
  char *in_stack_fffffffffffffcf8;
  char *in_stack_fffffffffffffd00;
  char local_2f8 [8];
  char *local_2c0;
  undefined8 local_2b8;
  undefined8 local_2b0;
  undefined8 uStack_2a8;
  undefined8 local_2a0;
  undefined8 uStack_298;
  char *local_290;
  char local_288 [48];
  ro_substr local_258;
  char *local_248;
  long local_240;
  basic_substring<char> local_238;
  basic_substring<char> local_228;
  ulong local_218;
  csubstr local_208;
  substr *local_1f8;
  undefined8 *local_1f0;
  basic_substring<char> *local_1e8;
  char **local_1e0;
  basic_substring<char> *local_1d8;
  basic_substring<char> *local_1d0;
  substr *local_1c8;
  basic_substring<char> *local_1c0;
  substr *local_1b8;
  basic_substring<char> *local_1b0;
  basic_substring<char> *local_1a8;
  char **local_1a0;
  char *local_198;
  size_t local_190;
  bool local_181;
  char *local_180;
  undefined4 local_178;
  undefined8 local_170;
  basic_substring<char> *local_168;
  char *local_160;
  ulong local_158;
  char *local_150;
  undefined4 local_148;
  ulong local_140;
  substr *local_138;
  undefined8 local_130;
  undefined8 local_128;
  char *local_120;
  undefined4 local_118;
  ulong local_110;
  substr *local_108;
  char *local_100;
  undefined8 local_f8;
  char *local_f0;
  undefined4 local_e8;
  ulong local_e0;
  substr *local_d8;
  char *local_d0;
  long local_c8;
  char *local_c0;
  undefined4 local_b8;
  ulong local_b0;
  substr *local_a8;
  char *local_a0;
  size_t local_98;
  char *local_90;
  undefined4 local_88;
  ulong local_80;
  substr *local_78;
  char *local_70;
  undefined4 local_68;
  ulong local_60;
  char *local_58;
  undefined4 local_50;
  ulong local_38;
  long local_30;
  basic_substring<char> *local_28;
  char *local_20;
  ulong local_18;
  basic_substring<char> *local_10;
  basic_substring<char> *local_8;
  
  c = (char)((ulong)in_stack_fffffffffffff870 >> 0x38);
  local_218 = (in_RDI->m_state->pos).super_LineCol.offset;
  local_a8 = &in_RDI->m_buf;
  local_b0 = local_218;
  if ((in_RDI->m_buf).len < local_218) {
    eVar11 = get_error_flags();
    if (((eVar11 & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
      trap_instruction();
    }
    local_c0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_b8 = 0x1533;
    handle_error(0x3f0daf,(char *)0x1533,"check failed: %s","first >= 0 && first <= len");
  }
  basic_substring<char>::basic_substring
            ((basic_substring<char> *)in_stack_fffffffffffff850,in_stack_fffffffffffff848,
             CONCAT44(in_stack_fffffffffffff844,in_stack_fffffffffffff840));
  local_228.str = local_a0;
  local_228.len = local_98;
  bVar10 = basic_substring<char>::begins_with(&local_228,' ');
  if (bVar10) {
    local_238 = basic_substring<char>::triml
                          ((basic_substring<char> *)
                           CONCAT17(in_stack_fffffffffffff87f,
                                    CONCAT16(in_stack_fffffffffffff87e,
                                             CONCAT15(in_stack_fffffffffffff87d,
                                                      CONCAT14(in_stack_fffffffffffff87c,
                                                               in_stack_fffffffffffff878)))),c);
    local_228.str = local_238.str;
    local_228.len = local_238.len;
    local_d8 = &in_RDI->m_buf;
    local_e0 = local_218;
    if ((in_RDI->m_buf).len < local_218) {
      eVar11 = get_error_flags();
      if (((eVar11 & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
        trap_instruction();
      }
      local_f0 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_e8 = 0x1533;
      handle_error(0x3f0daf,(char *)0x1533,"check failed: %s","first >= 0 && first <= len");
    }
    basic_substring<char>::basic_substring
              ((basic_substring<char> *)in_stack_fffffffffffff850,in_stack_fffffffffffff848,
               CONCAT44(in_stack_fffffffffffff844,in_stack_fffffffffffff840));
    local_248 = local_d0;
    local_240 = local_c8;
    local_258 = basic_substring::operator_cast_to_basic_substring((basic_substring<char> *)0x3b4734)
    ;
    local_198 = local_258.str;
    local_190 = local_258.len;
    local_1a0 = &local_248;
    if (local_240 == 0) {
      local_692 = false;
      if ((local_258.len == 0) && (local_692 = false, local_258.str == local_248)) {
        local_692 = local_248 != (char *)0x0;
      }
      local_181 = local_692;
    }
    else {
      local_691 = local_248 <= local_258.str &&
                  local_258.str + local_258.len <= local_248 + local_240;
      local_181 = local_691;
    }
    if (((local_181 ^ 0xffU) & 1) != 0) {
      memcpy(local_288,"check failed: (m_buf.sub(b).is_super(s))",0x29);
      eVar11 = get_error_flags();
      if (((eVar11 & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
        trap_instruction();
      }
      p_Var12 = (in_RDI->m_stack).m_callbacks.m_error;
      Location::Location(in_stack_fffffffffffff850,in_stack_fffffffffffff848,
                         CONCAT44(in_stack_fffffffffffff844,in_stack_fffffffffffff840),
                         CONCAT44(in_stack_fffffffffffff83c,in_stack_fffffffffffff838),
                         CONCAT44(in_stack_fffffffffffff834,in_stack_fffffffffffff830));
      in_stack_fffffffffffff838 = (undefined4)local_2a0;
      in_stack_fffffffffffff83c = (undefined4)((ulong)local_2a0 >> 0x20);
      in_stack_fffffffffffff840 = (undefined4)uStack_298;
      in_stack_fffffffffffff844 = (undefined4)((ulong)uStack_298 >> 0x20);
      in_stack_fffffffffffff830 = (undefined4)uStack_2a8;
      in_stack_fffffffffffff834 = (undefined4)((ulong)uStack_2a8 >> 0x20);
      LVar1.super_LineCol.line._0_4_ = in_stack_fffffffffffff830;
      LVar1.super_LineCol.offset = local_2b0;
      LVar1.super_LineCol.line._4_4_ = in_stack_fffffffffffff834;
      LVar1.super_LineCol.col._0_4_ = in_stack_fffffffffffff838;
      LVar1.super_LineCol.col._4_4_ = in_stack_fffffffffffff83c;
      LVar1.name.str._0_4_ = in_stack_fffffffffffff840;
      LVar1.name.str._4_4_ = in_stack_fffffffffffff844;
      LVar1.name.len = (size_t)local_290;
      (*p_Var12)(local_288,0x29,LVar1,(in_RDI->m_stack).m_callbacks.m_user_data);
      in_stack_fffffffffffff848 = local_290;
    }
    pcVar9 = local_228.str;
    local_1d8 = &local_228;
    local_108 = &in_RDI->m_buf;
    local_110 = local_218;
    if ((in_RDI->m_buf).len < local_218) {
      eVar11 = get_error_flags();
      if (((eVar11 & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
        trap_instruction();
      }
      local_120 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_118 = 0x1533;
      handle_error(0x3f0daf,(char *)0x1533,"check failed: %s","first >= 0 && first <= len");
    }
    basic_substring<char>::basic_substring
              ((basic_substring<char> *)in_stack_fffffffffffff850,in_stack_fffffffffffff848,
               CONCAT44(in_stack_fffffffffffff844,in_stack_fffffffffffff840));
    local_2c0 = local_100;
    local_2b8 = local_f8;
    local_1e0 = &local_2c0;
    if (pcVar9 < local_100) {
      memcpy(local_2f8,"check failed: (s.begin() >= m_buf.sub(b).begin())",0x32);
      eVar11 = get_error_flags();
      if (((eVar11 & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
        trap_instruction();
      }
      p_Var12 = (in_RDI->m_stack).m_callbacks.m_error;
      Location::Location(in_stack_fffffffffffff850,in_stack_fffffffffffff848,
                         CONCAT44(in_stack_fffffffffffff844,in_stack_fffffffffffff840),
                         CONCAT44(in_stack_fffffffffffff83c,in_stack_fffffffffffff838),
                         CONCAT44(in_stack_fffffffffffff834,in_stack_fffffffffffff830));
      in_stack_fffffffffffff848 = in_stack_fffffffffffffd00;
      in_stack_fffffffffffff838 = SUB84(in_stack_fffffffffffffcf0,0);
      in_stack_fffffffffffff83c = (undefined4)((ulong)in_stack_fffffffffffffcf0 >> 0x20);
      in_stack_fffffffffffff840 = SUB84(in_stack_fffffffffffffcf8,0);
      in_stack_fffffffffffff844 = (undefined4)((ulong)in_stack_fffffffffffffcf8 >> 0x20);
      in_stack_fffffffffffff830 = (undefined4)uStack_318;
      in_stack_fffffffffffff834 = (undefined4)((ulong)uStack_318 >> 0x20);
      LVar2.super_LineCol.line._0_4_ = in_stack_fffffffffffff830;
      LVar2.super_LineCol.offset = local_320;
      LVar2.super_LineCol.line._4_4_ = in_stack_fffffffffffff834;
      LVar2.super_LineCol.col._0_4_ = in_stack_fffffffffffff838;
      LVar2.super_LineCol.col._4_4_ = in_stack_fffffffffffff83c;
      LVar2.name.str._0_4_ = in_stack_fffffffffffff840;
      LVar2.name.str._4_4_ = in_stack_fffffffffffff844;
      LVar2.name.len = (size_t)in_stack_fffffffffffff848;
      in_stack_fffffffffffffd00 = in_stack_fffffffffffff848;
      (*p_Var12)(local_2f8,0x32,LVar2,(in_RDI->m_stack).m_callbacks.m_user_data);
    }
    local_1e8 = &local_228;
    local_138 = &in_RDI->m_buf;
    local_140 = local_218;
    if ((in_RDI->m_buf).len < local_218) {
      eVar11 = get_error_flags();
      if (((eVar11 & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
        trap_instruction();
      }
      local_150 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_148 = 0x1533;
      handle_error(0x3f0daf,(char *)0x1533,"check failed: %s","first >= 0 && first <= len");
    }
    basic_substring<char>::basic_substring
              ((basic_substring<char> *)in_stack_fffffffffffff850,in_stack_fffffffffffff848,
               CONCAT44(in_stack_fffffffffffff844,in_stack_fffffffffffff840));
    local_330 = local_130;
    local_328 = local_128;
    local_1f0 = &local_330;
    _line_progressed(in_stack_fffffffffffff910,(size_t)in_stack_fffffffffffff908);
  }
  local_218 = (in_RDI->m_state->pos).super_LineCol.offset;
  bVar10 = basic_substring<char>::begins_with(&local_228,'\'');
  if (!bVar10) {
    memcpy(local_358,"check failed: (s.begins_with(\'\\\'\'))",0x24);
    eVar11 = get_error_flags();
    if (((eVar11 & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
      trap_instruction();
    }
    in_stack_fffffffffffff910 = (Parser *)(in_RDI->m_stack).m_callbacks.m_error;
    in_stack_fffffffffffff908 = local_358;
    Location::Location(in_stack_fffffffffffff850,in_stack_fffffffffffff848,
                       CONCAT44(in_stack_fffffffffffff844,in_stack_fffffffffffff840),
                       CONCAT44(in_stack_fffffffffffff83c,in_stack_fffffffffffff838),
                       CONCAT44(in_stack_fffffffffffff834,in_stack_fffffffffffff830));
    (*(code *)in_stack_fffffffffffff910)
              (in_stack_fffffffffffff908,0x24,(in_RDI->m_stack).m_callbacks.m_user_data);
    in_stack_fffffffffffff830 = uStack_378;
    in_stack_fffffffffffff834 = uStack_374;
    in_stack_fffffffffffff838 = local_370;
    in_stack_fffffffffffff83c = uStack_36c;
    in_stack_fffffffffffff840 = uStack_368;
    in_stack_fffffffffffff844 = uStack_364;
    in_stack_fffffffffffff848 = local_360;
  }
  _line_progressed(in_stack_fffffffffffff910,(size_t)in_stack_fffffffffffff908);
  local_168 = &local_228;
  local_170 = 1;
  if (local_228.len == 0) {
    eVar11 = get_error_flags();
    if (((eVar11 & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
      trap_instruction();
    }
    local_180 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_178 = 0x1533;
    handle_error(0x3f0daf,(char *)0x1533,"check failed: %s","first >= 0 && first <= len");
  }
  basic_substring<char>::basic_substring
            ((basic_substring<char> *)in_stack_fffffffffffff850,in_stack_fffffffffffff848,
             CONCAT44(in_stack_fffffffffffff844,in_stack_fffffffffffff840));
  local_390 = local_160;
  local_388 = local_158;
  local_228.str = local_160;
  local_228.len = local_158;
  local_391 = false;
  local_3a0 = 1;
  local_3a8 = 0xffffffffffffffff;
  while (bVar10 = _finished_file(in_RDI), ((bVar10 ^ 0xffU) & 1) != 0) {
    local_3b8.str = (in_RDI->m_state->line_contents).rem.str;
    local_3b8.len = (in_RDI->m_state->line_contents).rem.len;
    local_3b9 = '\x01';
    for (local_3c8 = 0; local_3c8 < local_3b8.len; local_3c8 = local_3c8 + 1) {
      local_3c9 = local_3b8.str[local_3c8];
      if (local_3c9 == '\'') {
        if (local_3c8 + 1 < local_3b8.len) {
          local_702 = local_3b8.str[local_3c8 + 1];
        }
        else {
          local_702 = '~';
        }
        local_3ca = local_702;
        if (local_702 != '\'') {
          local_3a8 = local_3c8;
          break;
        }
        local_391 = true;
        local_3c8 = local_3c8 + 1;
      }
      else if (local_3c9 != ' ') {
        local_3b9 = '\0';
      }
    }
    local_703 = true;
    if ((((local_391 & 1U) == 0) && (local_703 = true, local_3a0 < 2)) &&
       (local_703 = true, local_3b9 == '\0')) {
      bVar10 = _at_line_begin(in_RDI);
      local_704 = false;
      if (bVar10) {
        local_704 = basic_substring<const_char>::begins_with(&local_3b8,' ');
      }
      local_703 = local_704;
    }
    local_391 = local_703;
    if (local_3a8 != 0xffffffffffffffff) {
      if ((in_RDI->m_buf).len <= local_3a8) {
        memcpy(local_3f8,"check failed: (pos >= 0 && pos < m_buf.len)",0x2c);
        eVar11 = get_error_flags();
        if (((eVar11 & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
          trap_instruction();
        }
        p_Var12 = (in_RDI->m_stack).m_callbacks.m_error;
        Location::Location(in_stack_fffffffffffff850,in_stack_fffffffffffff848,
                           CONCAT44(in_stack_fffffffffffff844,in_stack_fffffffffffff840),
                           CONCAT44(in_stack_fffffffffffff83c,in_stack_fffffffffffff838),
                           CONCAT44(in_stack_fffffffffffff834,in_stack_fffffffffffff830));
        in_stack_fffffffffffff838 = (undefined4)local_410;
        in_stack_fffffffffffff83c = (undefined4)((ulong)local_410 >> 0x20);
        in_stack_fffffffffffff840 = (undefined4)uStack_408;
        in_stack_fffffffffffff844 = (undefined4)((ulong)uStack_408 >> 0x20);
        in_stack_fffffffffffff830 = (undefined4)uStack_418;
        in_stack_fffffffffffff834 = (undefined4)((ulong)uStack_418 >> 0x20);
        LVar3.super_LineCol.line._0_4_ = in_stack_fffffffffffff830;
        LVar3.super_LineCol.offset = local_420;
        LVar3.super_LineCol.line._4_4_ = in_stack_fffffffffffff834;
        LVar3.super_LineCol.col._0_4_ = in_stack_fffffffffffff838;
        LVar3.super_LineCol.col._4_4_ = in_stack_fffffffffffff83c;
        LVar3.name.str._0_4_ = in_stack_fffffffffffff840;
        LVar3.name.str._4_4_ = in_stack_fffffffffffff844;
        LVar3.name.len = (size_t)local_400;
        (*p_Var12)(local_3f8,0x2c,LVar3,(in_RDI->m_stack).m_callbacks.m_user_data);
        in_stack_fffffffffffff848 = local_400;
      }
      psVar13 = &in_RDI->m_buf;
      local_80 = (in_RDI->m_state->pos).super_LineCol.offset + local_3a8;
      local_78 = psVar13;
      if ((in_RDI->m_buf).len <= local_80) {
        eVar11 = get_error_flags();
        if (((eVar11 & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
          trap_instruction();
        }
        local_90 = 
        "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
        ;
        local_88 = 0x14c3;
        handle_error(0x3f0daf,(char *)0x14c3,"check failed: %s","i >= 0 && i < len");
      }
      if (psVar13->str[local_80] != '\'') {
        memcpy(local_468,"check failed: (m_buf[m_state->pos.offset + pos] == \'\\\'\')",0x39);
        eVar11 = get_error_flags();
        if (((eVar11 & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
          trap_instruction();
        }
        p_Var12 = (in_RDI->m_stack).m_callbacks.m_error;
        Location::Location(in_stack_fffffffffffff850,in_stack_fffffffffffff848,
                           CONCAT44(in_stack_fffffffffffff844,in_stack_fffffffffffff840),
                           CONCAT44(in_stack_fffffffffffff83c,in_stack_fffffffffffff838),
                           CONCAT44(in_stack_fffffffffffff834,in_stack_fffffffffffff830));
        in_stack_fffffffffffff838 = (undefined4)local_480;
        in_stack_fffffffffffff83c = (undefined4)((ulong)local_480 >> 0x20);
        in_stack_fffffffffffff840 = (undefined4)uStack_478;
        in_stack_fffffffffffff844 = (undefined4)((ulong)uStack_478 >> 0x20);
        in_stack_fffffffffffff830 = (undefined4)uStack_488;
        in_stack_fffffffffffff834 = (undefined4)((ulong)uStack_488 >> 0x20);
        LVar4.super_LineCol.line._0_4_ = in_stack_fffffffffffff830;
        LVar4.super_LineCol.offset = local_490;
        LVar4.super_LineCol.line._4_4_ = in_stack_fffffffffffff834;
        LVar4.super_LineCol.col._0_4_ = in_stack_fffffffffffff838;
        LVar4.super_LineCol.col._4_4_ = in_stack_fffffffffffff83c;
        LVar4.name.str._0_4_ = in_stack_fffffffffffff840;
        LVar4.name.str._4_4_ = in_stack_fffffffffffff844;
        LVar4.name.len = (size_t)local_470;
        (*p_Var12)(local_468,0x39,LVar4,(in_RDI->m_stack).m_callbacks.m_user_data);
        in_stack_fffffffffffff848 = local_470;
      }
      _line_progressed(in_stack_fffffffffffff910,(size_t)in_stack_fffffffffffff908);
      local_3a8 = ((in_RDI->m_state->pos).super_LineCol.offset - local_218) - 1;
      break;
    }
    _line_progressed(in_stack_fffffffffffff910,(size_t)in_stack_fffffffffffff908);
    local_3a0 = local_3a0 + 1;
    _line_ended(in_stack_fffffffffffff8e0);
    _scan_line(in_stack_fffffffffffff8b0);
  }
  if (local_3a8 == 0xffffffffffffffff) {
    bVar10 = is_debugger_attached();
    if ((bVar10) && (bVar10 = is_debugger_attached(), bVar10)) {
      trap_instruction();
    }
    basic_substring<char_const>::basic_substring<59ul>
              (local_4a0,(char (*) [59])"ERROR: reached end of file while looking for closing quote"
              );
    fmt.len = (size_t)in_stack_fffffffffffffd00;
    fmt.str = in_stack_fffffffffffffcf8;
    _err<>(in_stack_fffffffffffffcf0,fmt);
    goto LAB_003b5ae8;
  }
  if (local_3a8 == 0) {
    builtin_strncpy(local_4b8,"check failed: (pos > 0)",0x18);
    eVar11 = get_error_flags();
    if (((eVar11 & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
      trap_instruction();
    }
    p_Var12 = (in_RDI->m_stack).m_callbacks.m_error;
    Location::Location(in_stack_fffffffffffff850,in_stack_fffffffffffff848,
                       CONCAT44(in_stack_fffffffffffff844,in_stack_fffffffffffff840),
                       CONCAT44(in_stack_fffffffffffff83c,in_stack_fffffffffffff838),
                       CONCAT44(in_stack_fffffffffffff834,in_stack_fffffffffffff830));
    in_stack_fffffffffffff838 = (undefined4)local_4d0;
    in_stack_fffffffffffff83c = (undefined4)((ulong)local_4d0 >> 0x20);
    in_stack_fffffffffffff840 = (undefined4)uStack_4c8;
    in_stack_fffffffffffff844 = (undefined4)((ulong)uStack_4c8 >> 0x20);
    in_stack_fffffffffffff830 = (undefined4)uStack_4d8;
    in_stack_fffffffffffff834 = (undefined4)((ulong)uStack_4d8 >> 0x20);
    LVar5.super_LineCol.line._0_4_ = in_stack_fffffffffffff830;
    LVar5.super_LineCol.offset = local_4e0;
    LVar5.super_LineCol.line._4_4_ = in_stack_fffffffffffff834;
    LVar5.super_LineCol.col._0_4_ = in_stack_fffffffffffff838;
    LVar5.super_LineCol.col._4_4_ = in_stack_fffffffffffff83c;
    LVar5.name.str._0_4_ = in_stack_fffffffffffff840;
    LVar5.name.str._4_4_ = in_stack_fffffffffffff844;
    LVar5.name.len = (size_t)local_4c0;
    (*p_Var12)(local_4b8,0x18,LVar5,(in_RDI->m_stack).m_callbacks.m_user_data);
    in_stack_fffffffffffff848 = local_4c0;
  }
  local_1a8 = &local_228;
  local_1f8 = &in_RDI->m_buf;
  if (local_228.str + local_228.len < local_1f8->str) {
LAB_003b5629:
    memcpy(local_528,"check failed: (s.end() >= m_buf.begin() && s.end() <= m_buf.end())",0x43);
    eVar11 = get_error_flags();
    if (((eVar11 & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
      trap_instruction();
    }
    p_Var12 = (in_RDI->m_stack).m_callbacks.m_error;
    Location::Location(in_stack_fffffffffffff850,in_stack_fffffffffffff848,
                       CONCAT44(in_stack_fffffffffffff844,in_stack_fffffffffffff840),
                       CONCAT44(in_stack_fffffffffffff83c,in_stack_fffffffffffff838),
                       CONCAT44(in_stack_fffffffffffff834,in_stack_fffffffffffff830));
    in_stack_fffffffffffff838 = (undefined4)local_540;
    in_stack_fffffffffffff83c = (undefined4)((ulong)local_540 >> 0x20);
    in_stack_fffffffffffff840 = (undefined4)uStack_538;
    in_stack_fffffffffffff844 = (undefined4)((ulong)uStack_538 >> 0x20);
    in_stack_fffffffffffff830 = (undefined4)uStack_548;
    in_stack_fffffffffffff834 = (undefined4)((ulong)uStack_548 >> 0x20);
    LVar6.super_LineCol.line._0_4_ = in_stack_fffffffffffff830;
    LVar6.super_LineCol.offset = local_550;
    LVar6.super_LineCol.line._4_4_ = in_stack_fffffffffffff834;
    LVar6.super_LineCol.col._0_4_ = in_stack_fffffffffffff838;
    LVar6.super_LineCol.col._4_4_ = in_stack_fffffffffffff83c;
    LVar6.name.str._0_4_ = in_stack_fffffffffffff840;
    LVar6.name.str._4_4_ = in_stack_fffffffffffff844;
    LVar6.name.len = (size_t)local_530;
    (*p_Var12)(local_528,0x43,LVar6,(in_RDI->m_stack).m_callbacks.m_user_data);
    in_stack_fffffffffffff848 = local_530;
  }
  else {
    local_1b0 = &local_228;
    local_1b8 = &in_RDI->m_buf;
    if (local_1b8->str + (in_RDI->m_buf).len < local_228.str + local_228.len) goto LAB_003b5629;
  }
  local_1c0 = &local_228;
  local_1c8 = &in_RDI->m_buf;
  if ((local_228.str + local_228.len != local_1c8->str + (in_RDI->m_buf).len) &&
     (local_1d0 = &local_228, local_228.str[local_228.len] != '\'')) {
    memcpy(local_598,"check failed: (s.end() == m_buf.end() || *s.end() == \'\\\'\')",0x3b);
    eVar11 = get_error_flags();
    if (((eVar11 & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
      trap_instruction();
    }
    p_Var12 = (in_RDI->m_stack).m_callbacks.m_error;
    Location::Location(in_stack_fffffffffffff850,in_stack_fffffffffffff848,
                       CONCAT44(in_stack_fffffffffffff844,in_stack_fffffffffffff840),
                       CONCAT44(in_stack_fffffffffffff83c,in_stack_fffffffffffff838),
                       CONCAT44(in_stack_fffffffffffff834,in_stack_fffffffffffff830));
    in_stack_fffffffffffff838 = (undefined4)local_5b0;
    in_stack_fffffffffffff83c = (undefined4)((ulong)local_5b0 >> 0x20);
    in_stack_fffffffffffff840 = (undefined4)uStack_5a8;
    in_stack_fffffffffffff844 = (undefined4)((ulong)uStack_5a8 >> 0x20);
    in_stack_fffffffffffff830 = (undefined4)uStack_5b8;
    in_stack_fffffffffffff834 = (undefined4)((ulong)uStack_5b8 >> 0x20);
    LVar7.super_LineCol.line._0_4_ = in_stack_fffffffffffff830;
    LVar7.super_LineCol.offset = local_5c0;
    LVar7.super_LineCol.line._4_4_ = in_stack_fffffffffffff834;
    LVar7.super_LineCol.col._0_4_ = in_stack_fffffffffffff838;
    LVar7.super_LineCol.col._4_4_ = in_stack_fffffffffffff83c;
    LVar7.name.str._0_4_ = in_stack_fffffffffffff840;
    LVar7.name.str._4_4_ = in_stack_fffffffffffff844;
    LVar7.name.len = (size_t)local_5a0;
    (*p_Var12)(local_598,0x3b,LVar7,(in_RDI->m_stack).m_callbacks.m_user_data);
    in_stack_fffffffffffff848 = local_5a0;
  }
  local_38 = local_3a8 - 1;
  local_28 = &local_228;
  local_30 = 0;
  if (local_228.len < local_38 && local_38 != 0xffffffffffffffff) {
    eVar11 = get_error_flags();
    if (((eVar11 & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
      trap_instruction();
    }
    local_58 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_50 = 0x153b;
    handle_error(0x3f0daf,(char *)0x153b,"check failed: %s",
                 "(num >= 0 && num <= len) || (num == npos)");
  }
  if (local_38 == 0xffffffffffffffff) {
    local_780 = local_228.len - local_30;
  }
  else {
    local_780 = local_38;
  }
  local_60 = local_780;
  if (local_228.len < local_30 + local_780 && local_38 != 0) {
    eVar11 = get_error_flags();
    if (((eVar11 & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
      trap_instruction();
    }
    local_70 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_68 = 0x153d;
    handle_error(0x3f0daf,(char *)0x153d,"check failed: %s",
                 "(first >= 0 && first + rnum <= len) || (num == 0)");
  }
  basic_substring<char>::basic_substring
            ((basic_substring<char> *)in_stack_fffffffffffff850,in_stack_fffffffffffff848,
             CONCAT44(in_stack_fffffffffffff844,in_stack_fffffffffffff840));
  local_5d0 = local_20;
  local_5c8 = local_18;
  local_228.str = local_20;
  local_228.len = local_18;
LAB_003b5ae8:
  if ((local_391 & 1U) == 0) {
    local_208 = basic_substring::operator_cast_to_basic_substring((basic_substring<char> *)0x3b5cec)
    ;
  }
  else {
    local_5e0 = local_228.str;
    local_5d8 = local_228.len;
    s_00.len = in_stack_fffffffffffff9c0;
    s_00.str = in_stack_fffffffffffff9b8;
    local_208 = _filter_squot_scalar(in_stack_fffffffffffff9b0,s_00);
    bVar10 = true;
    if (local_228.len < local_208.len) {
      local_8 = &local_228;
      bVar10 = true;
      if (local_228.len != 0 && local_228.str != (char *)0x0) {
        local_5f0 = basic_substring<char>::trim
                              ((basic_substring<char> *)
                               CONCAT44(in_stack_fffffffffffff844,in_stack_fffffffffffff840),
                               (char)((uint)in_stack_fffffffffffff83c >> 0x18));
        local_10 = &local_5f0;
        bVar10 = true;
        if (local_5f0.len != 0) {
          bVar10 = local_5f0.str == (char *)0x0;
        }
      }
    }
    if (!bVar10) {
      memcpy(&local_638,"check failed: (ret.len <= s.len || s.empty() || s.trim(\' \').empty())",
             0x45);
      eVar11 = get_error_flags();
      if (((eVar11 & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
        trap_instruction();
      }
      p_Var12 = (in_RDI->m_stack).m_callbacks.m_error;
      this_00 = &local_638;
      Location::Location(this_00,in_stack_fffffffffffff848,
                         CONCAT44(in_stack_fffffffffffff844,in_stack_fffffffffffff840),
                         CONCAT44(in_stack_fffffffffffff83c,in_stack_fffffffffffff838),
                         CONCAT44(in_stack_fffffffffffff834,in_stack_fffffffffffff830));
      LVar8.super_LineCol.line._0_4_ = (int)uStack_658;
      LVar8.super_LineCol.offset = local_660;
      LVar8.super_LineCol.line._4_4_ = (int)((ulong)uStack_658 >> 0x20);
      LVar8.super_LineCol.col._0_4_ = (int)in_stack_fffffffffffff9b0;
      LVar8.super_LineCol.col._4_4_ = (int)((ulong)in_stack_fffffffffffff9b0 >> 0x20);
      LVar8.name.str._0_4_ = (int)in_stack_fffffffffffff9b8;
      LVar8.name.str._4_4_ = (int)((ulong)in_stack_fffffffffffff9b8 >> 0x20);
      LVar8.name.len = in_stack_fffffffffffff9c0;
      (*p_Var12)((char *)this_00,0x45,LVar8,(in_RDI->m_stack).m_callbacks.m_user_data);
    }
  }
  return local_208;
}

Assistant:

csubstr Parser::_scan_squot_scalar()
{
    // quoted scalars can spread over multiple lines!
    // nice explanation here: http://yaml-multiline.info/

    // a span to the end of the file
    size_t b = m_state->pos.offset;
    substr s = m_buf.sub(b);
    if(s.begins_with(' '))
    {
        s = s.triml(' ');
        _RYML_CB_ASSERT(m_stack.m_callbacks, m_buf.sub(b).is_super(s));
        _RYML_CB_ASSERT(m_stack.m_callbacks, s.begin() >= m_buf.sub(b).begin());
        _line_progressed((size_t)(s.begin() - m_buf.sub(b).begin()));
    }
    b = m_state->pos.offset; // take this into account
    _RYML_CB_ASSERT(m_stack.m_callbacks, s.begins_with('\''));

    // skip the opening quote
    _line_progressed(1);
    s = s.sub(1);

    bool needs_filter = false;

    size_t numlines = 1; // we already have one line
    size_t pos = npos; // find the pos of the matching quote
    while( ! _finished_file())
    {
        const csubstr line = m_state->line_contents.rem;
        bool line_is_blank = true;
        _c4dbgpf("scanning single quoted scalar @ line[{}]: ~~~{}~~~", m_state->pos.line, line);
        for(size_t i = 0; i < line.len; ++i)
        {
            const char curr = line.str[i];
            if(curr == '\'') // single quotes are escaped with two single quotes
            {
                const char next = i+1 < line.len ? line.str[i+1] : '~';
                if(next != '\'') // so just look for the first quote
                {                // without another after it
                    pos = i;
                    break;
                }
                else
                {
                    needs_filter = true; // needs filter to remove escaped quotes
                    ++i; // skip the escaped quote
                }
            }
            else if(curr != ' ')
            {
                line_is_blank = false;
            }
        }

        // leading whitespace also needs filtering
        needs_filter = needs_filter
            || (numlines > 1)
            || line_is_blank
            || (_at_line_begin() && line.begins_with(' '));

        if(pos == npos)
        {
            _line_progressed(line.len);
            ++numlines;
        }
        else
        {
            _RYML_CB_ASSERT(m_stack.m_callbacks, pos >= 0 && pos < m_buf.len);
            _RYML_CB_ASSERT(m_stack.m_callbacks, m_buf[m_state->pos.offset + pos] == '\'');
            _line_progressed(pos + 1); // progress beyond the quote
            pos = m_state->pos.offset - b - 1; // but we stop before it
            break;
        }

        _line_ended();
        _scan_line();
    }

    if(pos == npos)
    {
        _c4err("reached end of file while looking for closing quote");
    }
    else
    {
        _RYML_CB_ASSERT(m_stack.m_callbacks, pos > 0);
        _RYML_CB_ASSERT(m_stack.m_callbacks, s.end() >= m_buf.begin() && s.end() <= m_buf.end());
        _RYML_CB_ASSERT(m_stack.m_callbacks, s.end() == m_buf.end() || *s.end() == '\'');
        s = s.sub(0, pos-1);
    }

    if(needs_filter)
    {
        csubstr ret = _filter_squot_scalar(s);
        _RYML_CB_ASSERT(m_stack.m_callbacks, ret.len <= s.len || s.empty() || s.trim(' ').empty());
        _c4dbgpf("final scalar: \"{}\"", ret);
        return ret;
    }

    _c4dbgpf("final scalar: \"{}\"", s);

    return s;
}